

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

ssize_t __thiscall
clask::response_writer::write(response_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  if (this->header_out == false) {
    (*this->_vptr_response_writer[2])(this);
  }
  sVar1 = send(this->s,*(void **)CONCAT44(in_register_00000034,__fd),
               (long)*(int *)((undefined8 *)CONCAT44(in_register_00000034,__fd) + 1),0x4000);
  return sVar1;
}

Assistant:

inline void response_writer::write(const std::string& content) {
  if (!header_out) {
    write_headers();
  }
  send(s, content.data(), (int) content.size(), MSG_NOSIGNAL);
}